

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void fetch_shift_register_byte
               (fetched_BG_bytes *fetched_bytes,ppu_regs *ppu_regs,uint16_t VRAM_address,
               uint16_t dot)

{
  uint8_t uVar1;
  uint16_t dot_local;
  uint16_t VRAM_address_local;
  ppu_regs *ppu_regs_local;
  fetched_BG_bytes *fetched_bytes_local;
  
  switch(dot & 7) {
  case 1:
    uVar1 = fetch_nametable_byte(VRAM_address);
    fetched_bytes->nametable_byte = uVar1;
    break;
  case 3:
    uVar1 = fetch_attribute_byte(VRAM_address);
    fetched_bytes->attribute_byte = uVar1;
    break;
  case 5:
    uVar1 = fetch_low_pattern_table_byte(ppu_regs,VRAM_address,fetched_bytes->nametable_byte);
    fetched_bytes->low_background_byte = uVar1;
    break;
  case 7:
    uVar1 = fetch_high_pattern_table_byte(ppu_regs,VRAM_address,fetched_bytes->nametable_byte);
    fetched_bytes->high_background_byte = uVar1;
  }
  return;
}

Assistant:

static void fetch_shift_register_byte(
    fetched_BG_bytes* fetched_bytes,
    ppu_regs* ppu_regs,
    uint16_t VRAM_address,
    uint16_t dot
) {
    switch( dot % 8 ) {
        case 1:
            fetched_bytes->nametable_byte = fetch_nametable_byte(VRAM_address);
            break;
        case 3:
            fetched_bytes->attribute_byte = fetch_attribute_byte(VRAM_address);
            break;
        case 5:
            fetched_bytes->low_background_byte = fetch_low_pattern_table_byte(ppu_regs, VRAM_address, fetched_bytes->nametable_byte);
            break;
        case 7:
            fetched_bytes->high_background_byte = fetch_high_pattern_table_byte(ppu_regs, VRAM_address, fetched_bytes->nametable_byte);
            break;
    }
}